

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_GetLastMessageReceiveTime
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,time_t *lastMessageReceiveTime)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  IOTHUB_CLIENT_RESULT result;
  time_t *lastMessageReceiveTime_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if ((iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) ||
     (lastMessageReceiveTime == (time_t *)0x0)) {
    handleData._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INVALID_ARG);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetLastMessageReceiveTime",0x8d9,1,"result = %s",pcVar2);
    }
  }
  else if (iotHubClientHandle->lastMessageReceiveTime == -1) {
    handleData._4_4_ = IOTHUB_CLIENT_INDEFINITE_TIME;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INDEFINITE_TIME);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetLastMessageReceiveTime",0x8e0,1,"result = %s",pcVar2);
    }
  }
  else {
    *lastMessageReceiveTime = iotHubClientHandle->lastMessageReceiveTime;
    handleData._4_4_ = IOTHUB_CLIENT_OK;
  }
  return handleData._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_GetLastMessageReceiveTime(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, time_t* lastMessageReceiveTime)
{
    IOTHUB_CLIENT_RESULT result;
    IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;

    if (handleData == NULL || lastMessageReceiveTime == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        if (handleData->lastMessageReceiveTime == INDEFINITE_TIME)
        {
            result = IOTHUB_CLIENT_INDEFINITE_TIME;
            LOG_ERROR_RESULT;
        }
        else
        {
            *lastMessageReceiveTime = handleData->lastMessageReceiveTime;
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}